

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

int16_t place_monster(chunk *c,loc_conflict grid,monster *mon,uint8_t origin)

{
  bitflag *flags;
  undefined2 uVar1;
  undefined2 uVar2;
  _Bool _Var3;
  _Bool good;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  uint8_t uVar8;
  short sVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  monster *pmVar12;
  monster_conflict *mon_00;
  monster_conflict *pmVar13;
  monster_lore *pmVar14;
  monster_race *pmVar15;
  object_kind *k;
  object *poVar16;
  ulong uVar17;
  long lVar18;
  wchar_t wVar19;
  artifact *paVar20;
  wchar_t idx;
  monster_drop *pmVar21;
  wchar_t wVar22;
  bool bVar23;
  
  wVar10 = mon->midx;
  _Var3 = square_in_bounds((chunk_conflict *)c,(loc)grid);
  if (!_Var3) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3ef,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar12 = square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar12 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3f0,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar10 < L'\x01') {
    sVar9 = mon_pop(c);
    if (sVar9 == 0) {
      return 0;
    }
  }
  else {
    sVar9 = (short)mon->midx;
    uVar1 = c->mon_max;
    uVar2 = c->mon_cnt;
    c->mon_max = uVar1 + 1;
    c->mon_cnt = uVar2 + 1;
  }
  idx = (wchar_t)sVar9;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1a0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,(loc)grid,idx);
  (mon_00->grid).x = grid.x;
  (mon_00->grid).y = grid.y;
  pmVar13 = (monster_conflict *)square_monster((chunk_conflict *)c,(loc)grid);
  if (pmVar13 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x406,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar10);
  update_mon(mon_00,c,true);
  _Var3 = flag_has_dbg(mon_00->race->flags,0xb,0x11,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var3) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar15 = mon_00->original_race;
  if (pmVar15 == (monster_race *)0x0) {
    pmVar15 = mon_00->race;
  }
  pmVar15->cur_num = pmVar15->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar14 = get_lore(mon_00->race);
    pmVar15 = mon_00->original_race;
    if (pmVar15 == (monster_race *)0x0) {
      pmVar15 = mon_00->race;
    }
    flags = pmVar15->flags;
    _Var3 = flag_has_dbg(flags,0xb,0x26,"effective_race->flags","RF_DROP_GREAT");
    good = true;
    if (!_Var3) {
      good = flag_has_dbg(flags,0xb,0x25,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var4 = flag_has_dbg(flags,0xb,0x1e,"effective_race->flags","RF_ONLY_ITEM");
    _Var5 = flag_has_dbg(flags,0xb,0x1d,"effective_race->flags","RF_ONLY_GOLD");
    wVar10 = mon_create_drop_count(pmVar15,false,false,(int *)0x0);
    _Var6 = monster_is_unique((monster *)mon_00);
    if (_Var6) {
      wVar22 = wVar10 - (uint)pmVar14->thefts;
      wVar10 = L'\0';
      if (L'\0' < wVar22) {
        wVar10 = wVar22;
      }
    }
    wVar22 = pmVar15->level;
    _Var6 = monster_is_unique((monster *)mon_00);
    wVar19 = wVar22;
    if (_Var6) {
      wVar19 = wVar22 * 2;
      if (wVar22 + L'\x0f' < wVar22 * 2) {
        wVar19 = wVar22 + L'\x0f';
      }
    }
    wVar22 = (c->depth + wVar19) / 2;
    if (wVar19 < wVar22) {
      wVar19 = wVar22;
    }
    wVar22 = L'd';
    if (wVar19 < L'd') {
      wVar22 = wVar19;
    }
    _Var7 = flag_has_dbg(flags,0xb,2,"effective_race->flags","RF_QUESTOR");
    if ((_Var7) && (pmVar15->level == L'd')) {
      lVar18 = 0x140;
      for (uVar17 = 1; paVar20 = a_info, uVar17 < z_info->a_max; uVar17 = uVar17 + 1) {
        k = lookup_kind(*(wchar_t *)(a_info->flags + lVar18 + -0x28),
                        *(wchar_t *)(a_info->flags + lVar18 + -0x24));
        _Var7 = flag_has_dbg(k->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART");
        if (_Var7) {
          paVar20 = (artifact *)(paVar20->flags + lVar18 + -0x48);
          poVar16 = (object *)mem_zalloc(0x138);
          object_prep(poVar16,k,L'd',RANDOMISE);
          poVar16->artifact = paVar20;
          copy_artifact_data(poVar16,paVar20);
          mark_artifact_created(paVar20,true);
          poVar16->origin = origin;
          uVar8 = convert_depth_to_origin(c->depth);
          poVar16->origin_depth = uVar8;
          poVar16->origin_race = mon_00->race;
          poVar16->number = '\x01';
          _Var7 = monster_carry(c,mon_00,poVar16);
          if (!_Var7) {
            mark_artifact_created(poVar16->artifact,false);
            object_wipe(poVar16);
            mem_free(poVar16);
          }
        }
        lVar18 = lVar18 + 0x140;
      }
    }
    pmVar21 = (monster_drop *)&pmVar15->drops;
    while (pmVar21 = pmVar21->next, pmVar21 != (monster_drop *)0x0) {
      uVar11 = Rand_div(100);
      if (uVar11 < pmVar21->percent_chance) {
        if (pmVar21->kind == (object_kind *)0x0) {
          if (pmVar21->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                          ,0x34a,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar16 = make_object(c,wVar22,good,_Var3,_Var6,(int32_t *)0x0,pmVar21->tval);
        }
        else {
          poVar16 = (object *)mem_zalloc(0x138);
          object_prep(poVar16,pmVar21->kind,wVar22,RANDOMISE);
          apply_magic(poVar16,wVar22,true,good,_Var3,_Var6);
        }
        if (poVar16 != (object *)0x0) {
          poVar16->origin = origin;
          uVar8 = convert_depth_to_origin(c->depth);
          poVar16->origin_depth = uVar8;
          poVar16->origin_race = pmVar15;
          uVar8 = '\x01';
          if (poVar16->artifact == (artifact *)0x0) {
            uVar11 = Rand_div(pmVar21->max - pmVar21->min);
            uVar8 = (char)uVar11 + (char)pmVar21->min;
          }
          poVar16->number = uVar8;
          _Var7 = monster_carry(c,mon_00,poVar16);
          if (!_Var7) {
            object_wipe(poVar16);
            mem_free(poVar16);
          }
        }
      }
    }
    if (wVar10 < L'\x01') {
      wVar10 = L'\0';
    }
LAB_0016c9c7:
    bVar23 = wVar10 != L'\0';
    wVar10 = wVar10 + L'\xffffffff';
    if (bVar23) {
      if ((_Var4) || ((!_Var5 && (uVar11 = Rand_div(100), 0x31 < (int)uVar11)))) goto LAB_0016c9d8;
      poVar16 = make_gold(wVar22,"any");
      goto LAB_0016ca26;
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,(monster *)mon_00,idx);
    }
  }
  return sVar9;
LAB_0016c9d8:
  poVar16 = make_object(c,wVar22,good,_Var3,_Var6,(int32_t *)0x0,L'\0');
  if (poVar16 != (object *)0x0) {
LAB_0016ca26:
    poVar16->origin = origin;
    uVar8 = convert_depth_to_origin(c->depth);
    poVar16->origin_depth = uVar8;
    poVar16->origin_race = pmVar15;
    _Var7 = monster_carry(c,mon_00,poVar16);
    if (!_Var7) {
      if (poVar16->artifact != (artifact *)0x0) {
        mark_artifact_created(poVar16->artifact,false);
      }
      object_wipe(poVar16);
      mem_free(poVar16);
    }
  }
  goto LAB_0016c9c7;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}